

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_algorithm_deflate.c
# Opt level: O1

_Bool input(void *ud,zip_uint8_t *data,zip_uint64_t length)

{
  char cVar1;
  int iVar2;
  zip_buffer_t *buffer;
  ulong uVar3;
  _Bool _Var4;
  int ze;
  zip_error_t *err;
  ulong __n;
  Bytef empty_buffer [1];
  undefined1 local_31;
  
  if ((length >> 0x20 == 0) && (*(long *)((long)ud + 0x20) == 0)) {
    if ((*(short *)((long)ud + 0xa0) == 0xe) &&
       ((*(char *)((long)ud + 8) == '\0' && (*(int *)((long)ud + 0xb4) == 0)))) {
      uVar3 = 9 - (ulong)*(byte *)((long)ud + 0xb3);
      if (length <= uVar3) {
        uVar3 = length;
      }
      __n = uVar3 & 0xff;
      memcpy((void *)((long)ud + (ulong)*(byte *)((long)ud + 0xb3) + 0xa2),data,__n);
      cVar1 = (char)uVar3 + *(char *)((long)ud + 0xb3);
      *(char *)((long)ud + 0xb3) = cVar1;
      length = length - __n;
      data = data + __n;
      if (cVar1 == '\t') {
        ze = 0x1f;
        if ((*(char *)((long)ud + 0xa4) == '\x05') && (*(char *)((long)ud + 0xa5) == '\0')) {
          buffer = _zip_buffer_new((zip_uint8_t *)((long)ud + 0xab),8);
          if (buffer == (zip_buffer_t *)0x0) {
            ze = 0xe;
          }
          else {
            _zip_buffer_put_64(buffer,*(zip_uint64_t *)((long)ud + 0xb8));
            _zip_buffer_free(buffer);
            *(long *)((long)ud + 0x18) = (long)ud + 0xa6;
            *(undefined8 *)((long)ud + 0x20) = 0xd;
            *(undefined8 *)((long)ud + 0x28) = 0;
            *(undefined1 **)((long)ud + 0x30) = &local_31;
            *(undefined8 *)((long)ud + 0x38) = 1;
            *(undefined8 *)((long)ud + 0x40) = 0;
            iVar2 = lzma_code((long)ud + 0x18,0);
            if ((iVar2 == 0) && (*(long *)((long)ud + 0x40) == 0)) {
              *(undefined4 *)((long)ud + 0xb4) = 2;
              goto LAB_00113bff;
            }
          }
        }
        err = *ud;
        goto LAB_00113ac3;
      }
    }
LAB_00113bff:
    *(zip_uint64_t *)((long)ud + 0x20) = length & 0xffffffff;
    *(zip_uint8_t **)((long)ud + 0x18) = data;
    _Var4 = true;
  }
  else {
    err = *ud;
    ze = 0x12;
LAB_00113ac3:
    _Var4 = false;
    zip_error_set(err,ze,0);
  }
  return _Var4;
}

Assistant:

static bool
input(void *ud, zip_uint8_t *data, zip_uint64_t length) {
    struct ctx *ctx = (struct ctx *)ud;

    if (length > UINT_MAX || ctx->zstr.avail_in > 0) {
        zip_error_set(ctx->error, ZIP_ER_INVAL, 0);
        return false;
    }

    ctx->zstr.avail_in = (uInt)length;
    ctx->zstr.next_in = (Bytef *)data;

    return true;
}